

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenaViolation.c
# Opt level: O2

Aig_Man_t *
createNewAigWith0LivePoWithDSC
          (Aig_Man_t *pAig,Vec_Ptr_t *signalList,int *index0Live,int windowBeginIndex,
          int withinWindowIndex,int pendingSignalIndex,Vec_Ptr_t *vBarriers)

{
  int iVar1;
  Aig_Man_t *pAigNew;
  size_t sVar2;
  char *__s;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *vBarrierLo;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *vBarrierLiDriver;
  Vec_Ptr_t *vMonotoneDisjunctionNodes;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *p_00;
  ulong uVar10;
  Aig_Obj_t *pAVar11;
  int iVar12;
  int iVar13;
  int i;
  Aig_Man_t *pAVar14;
  int iVar15;
  int iVar16;
  
  pAigNew = Aig_ManStart(pAig->vObjs->nSize);
  sVar2 = strlen(pAig->pName);
  __s = (char *)malloc(sVar2 + 7);
  pAigNew->pName = __s;
  sprintf(__s,"%s_%s",pAig->pName,"0Live");
  pAigNew->pSpec = (char *)0x0;
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pAigNew->pConst1;
  for (iVar12 = 0; iVar12 < pAig->nTruePis; iVar12 = iVar12 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,iVar12);
    pAVar4 = Aig_ObjCreateCi(pAigNew);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
  }
  iVar12 = 0;
  for (iVar13 = 0; iVar13 < pAig->nRegs; iVar13 = iVar13 + 1) {
    pvVar3 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar13);
    pAVar4 = Aig_ObjCreateCi(pAigNew);
    *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
    iVar12 = iVar12 + -1;
  }
  vBarrierLo = createArenaLO(pAigNew,vBarriers);
  iVar13 = vBarrierLo->nSize;
  pAVar4 = Aig_ObjCreateCi(pAigNew);
  pAVar5 = Aig_ObjCreateCi(pAigNew);
  p = createMonotoneBarrierLO(pAigNew,vBarriers);
  iVar1 = p->nSize;
  for (iVar16 = 0; iVar16 < pAig->vObjs->nSize; iVar16 = iVar16 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar16);
    if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
      pAVar7 = Aig_ObjChild0Copy(pAVar6);
      if (((ulong)pAVar6 & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
      }
      uVar10 = (ulong)pAVar6->pFanin1 & 0xfffffffffffffffe;
      if (uVar10 == 0) {
        pAVar11 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar11 = (Aig_Obj_t *)((ulong)((uint)pAVar6->pFanin1 & 1) ^ *(ulong *)(uVar10 + 0x28));
      }
      pAVar7 = Aig_And(pAigNew,pAVar7,pAVar11);
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  pAVar14 = pAig;
  pAVar6 = Aig_ManCo(pAig,windowBeginIndex);
  pAVar6 = driverToPoNew(pAVar14,pAVar6);
  pAVar14 = pAig;
  pAVar7 = Aig_ManCo(pAig,withinWindowIndex);
  pAVar7 = driverToPoNew(pAVar14,pAVar7);
  vBarrierLiDriver = Vec_PtrAlloc(vBarriers->nSize);
  vMonotoneDisjunctionNodes = Vec_PtrAlloc(vBarriers->nSize);
  pAVar6 = createArenaViolation
                     (pAig,pAigNew,pAVar6,pAVar7,vBarriers,vBarrierLo,vBarrierLiDriver,
                      vMonotoneDisjunctionNodes);
  if (vMonotoneDisjunctionNodes->nSize != vBarriers->nSize) {
    __assert_fail("Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0x1aa,
                  "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                 );
  }
  pAVar6 = Aig_Or(pAigNew,pAVar6,pAVar4);
  pAVar14 = pAig;
  pAVar7 = Aig_ManCo(pAig,pendingSignalIndex);
  pAVar7 = driverToPoNew(pAVar14,pAVar7);
  pAVar11 = Aig_And(pAigNew,pAVar7,pAVar5);
  pAVar5 = pAigNew->pConst1;
  for (iVar16 = 0; iVar16 < vMonotoneDisjunctionNodes->nSize; iVar16 = iVar16 + 1) {
    pAVar8 = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneDisjunctionNodes,iVar16);
    pAVar9 = (Aig_Obj_t *)Vec_PtrEntry(p,iVar16);
    pAVar9 = Aig_And(pAigNew,pAVar11,pAVar9);
    pAVar8 = Aig_Or(pAigNew,(Aig_Obj_t *)((ulong)pAVar9 ^ 1),pAVar8);
    pAVar5 = Aig_And(pAigNew,pAVar5,pAVar8);
  }
  for (iVar16 = 0; iVar16 < pAig->nTruePos; iVar16 = iVar16 + 1) {
    pAVar11 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar16);
    pAVar8 = Aig_ObjChild0Copy(pAVar11);
    pAVar8 = Aig_ObjCreateCo(pAigNew,pAVar8);
    (pAVar11->field_5).pData = pAVar8;
  }
  pAVar11 = createConstrained0LiveConeWithDSC(pAigNew,signalList);
  pAVar4 = Aig_Or(pAigNew,pAVar11,pAVar4);
  pAVar4 = Aig_And(pAigNew,pAVar4,pAVar5);
  Aig_ObjCreateCo(pAigNew,pAVar4);
  *index0Live = iVar16;
  iVar15 = iVar13 + iVar1;
  for (iVar16 = 0; iVar16 < pAig->nRegs; iVar16 = iVar16 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar16);
    pAVar5 = Aig_ObjChild0Copy(pAVar4);
    pAVar5 = Aig_ObjCreateCo(pAigNew,pAVar5);
    (pAVar4->field_5).pData = pAVar5;
    iVar15 = iVar15 + -1;
  }
  if (vBarrierLiDriver->nSize == vBarriers->nSize) {
    p_00 = createArenaLi(pAigNew,vBarriers,vBarrierLiDriver);
    iVar16 = p_00->nSize;
    Aig_ObjCreateCo(pAigNew,pAVar6);
    Aig_ObjCreateCo(pAigNew,pAVar7);
    for (i = 0; i < vMonotoneDisjunctionNodes->nSize; i = i + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneDisjunctionNodes,i);
      Aig_ObjCreateCo(pAigNew,pAVar4);
    }
    if ((iVar15 - iVar16) - iVar12 == i) {
      Aig_ManSetRegNum(pAigNew,((iVar13 + iVar1) - iVar12) + 2);
      Aig_ManCleanup(pAigNew);
      iVar12 = Aig_ManCheck(pAigNew);
      if (iVar12 != 0) {
        Vec_PtrFree(vBarrierLo);
        Vec_PtrFree(p);
        Vec_PtrFree(vBarrierLiDriver);
        Vec_PtrFree(p_00);
        Vec_PtrFree(vMonotoneDisjunctionNodes);
        return pAigNew;
      }
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                    ,0x206,
                    "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                   );
    }
    __assert_fail("loCopied + loCreated == liCopied + liCreated",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                  ,0x201,
                  "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
                 );
  }
  __assert_fail("Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/arenaViolation.c"
                ,0x1e5,
                "Aig_Man_t *createNewAigWith0LivePoWithDSC(Aig_Man_t *, Vec_Ptr_t *, int *, int, int, int, Vec_Ptr_t *)"
               );
}

Assistant:

Aig_Man_t *createNewAigWith0LivePoWithDSC( Aig_Man_t *pAig, Vec_Ptr_t *signalList, int *index0Live, int windowBeginIndex, int withinWindowIndex, int pendingSignalIndex, Vec_Ptr_t *vBarriers )
{
	Aig_Man_t *pNewAig;
	Aig_Obj_t *pObj, *pObjNewPoDriver;
	int i;
	int loCopied = 0, loCreated = 0, liCopied = 0, liCreated = 0;
	Aig_Obj_t *pObjWindowBeginsNew, *pObjWithinWindowNew, *pObjArenaViolation, *pObjTarget, *pObjArenaViolationLiDriver;
	Aig_Obj_t *pObjNewPoDriverArenaViolated, *pObjArenaViolationLo;
	Vec_Ptr_t *vBarrierLo, *vBarrierLiDriver, *vBarrierLi;
	Vec_Ptr_t *vMonotoneNodes;

#ifdef BARRIER_MONOTONE_TEST
	Aig_Obj_t *pObjPendingSignal;
	Aig_Obj_t *pObjPendingFlopLo;
	Vec_Ptr_t *vMonotoneBarrierLo;
	Aig_Obj_t *pObjPendingAndPendingSignal, *pObjMonotoneAnd, *pObjCurrMonotoneLo;
#endif

	//assert( Vec_PtrSize( signalList ) > 1 );

	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_0Live") + 1 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "0Live");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCi( pNewAig );
	}

	//****************************************************************
	// Step 4: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi( pNewAig );
    	}

	//****************************************************************
	// Step 4.a: create register outputs for the barrier flops
	//****************************************************************
	vBarrierLo = createArenaLO( pNewAig, vBarriers );
	loCreated = Vec_PtrSize(vBarrierLo);

	//****************************************************************
	// Step 4.b: create register output for arenaViolationFlop
	//****************************************************************
	pObjArenaViolationLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 4.c: create register output for pendingFlop
	//****************************************************************
	pObjPendingFlopLo = Aig_ObjCreateCi( pNewAig );
	loCreated++;

	//****************************************************************
	// Step 4.d: create register outputs for the barrier flops
	// for asserting monotonicity
	//****************************************************************
	vMonotoneBarrierLo = createMonotoneBarrierLO( pNewAig, vBarriers );
	loCreated = loCreated + Vec_PtrSize(vMonotoneBarrierLo);
#endif

	//********************************************************************
	// Step 5: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}

	//********************************************************************
	// Step 5.a: create internal nodes corresponding to arenaViolation
	//********************************************************************
	pObjTarget = Aig_ManCo( pAig, windowBeginIndex );
	pObjWindowBeginsNew = driverToPoNew( pAig, pObjTarget );

	pObjTarget = Aig_ManCo( pAig, withinWindowIndex );
	pObjWithinWindowNew = driverToPoNew( pAig, pObjTarget );

	vBarrierLiDriver = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );
	vMonotoneNodes = Vec_PtrAlloc( Vec_PtrSize(vBarriers) );

	pObjArenaViolation = createArenaViolation( pAig, pNewAig, 
				pObjWindowBeginsNew, pObjWithinWindowNew, 
				vBarriers, vBarrierLo, vBarrierLiDriver, vMonotoneNodes ); 
	assert( Vec_PtrSize(vMonotoneNodes) == Vec_PtrSize(vBarriers) );

#ifdef ARENA_VIOLATION_CONSTRAINT

#endif

	pObjArenaViolationLiDriver = Aig_Or( pNewAig, pObjArenaViolation, pObjArenaViolationLo );

#ifdef BARRIER_MONOTONE_TEST
	//********************************************************************
	// Step 5.b: Create internal nodes for monotone testing
	//********************************************************************

	pObjTarget = Aig_ManCo( pAig, pendingSignalIndex );
	pObjPendingSignal = driverToPoNew( pAig, pObjTarget );
	
	pObjPendingAndPendingSignal = Aig_And( pNewAig, pObjPendingSignal, pObjPendingFlopLo );
	pObjMonotoneAnd = Aig_ManConst1( pNewAig );
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		pObjCurrMonotoneLo = (Aig_Obj_t *)Vec_PtrEntry(vMonotoneBarrierLo, i);
		pObjMonotoneAnd = Aig_And( pNewAig, pObjMonotoneAnd,
			Aig_Or( pNewAig, 
			Aig_Not(Aig_And(pNewAig, pObjPendingAndPendingSignal, pObjCurrMonotoneLo)),
			pObj ) );
	}
#endif

	//********************************************************************
	// Step 6: create primary outputs
	//********************************************************************

	Saig_ManForEachPo( pAig, pObj, i )
	{
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	pObjNewPoDriver = createConstrained0LiveConeWithDSC( pNewAig, signalList );
	pObjNewPoDriverArenaViolated = Aig_Or( pNewAig, pObjNewPoDriver, pObjArenaViolationLo );
#ifdef BARRIER_MONOTONE_TEST
	pObjNewPoDriverArenaViolated = Aig_And( pNewAig, pObjNewPoDriverArenaViolated, pObjMonotoneAnd );
#endif
	Aig_ObjCreateCo( pNewAig, pObjNewPoDriverArenaViolated );

	*index0Live = i;

	//********************************************************************
	// Step 7: create register inputs
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}

	//********************************************************************
	// Step 7.a: create register inputs for barrier flops
	//********************************************************************
	assert( Vec_PtrSize(vBarrierLiDriver) == Vec_PtrSize(vBarriers) );
	vBarrierLi = createArenaLi( pNewAig, vBarriers, vBarrierLiDriver );
	liCreated = Vec_PtrSize( vBarrierLi );

	//********************************************************************
	// Step 7.b: create register inputs for arenaViolation flop
	//********************************************************************
	Aig_ObjCreateCo( pNewAig, pObjArenaViolationLiDriver );
	liCreated++;

#ifdef BARRIER_MONOTONE_TEST
	//****************************************************************
	// Step 7.c: create register input for pendingFlop
	//****************************************************************
	Aig_ObjCreateCo( pNewAig, pObjPendingSignal);
	liCreated++;

	//********************************************************************
	// Step 7.d: create register inputs for the barrier flops
	// for asserting monotonicity
	//********************************************************************
	Vec_PtrForEachEntry( Aig_Obj_t *, vMonotoneNodes, pObj, i )
	{
		Aig_ObjCreateCo( pNewAig, pObj );
		liCreated++;
	}
#endif

	assert(loCopied + loCreated == liCopied + liCreated);
	//next step should be changed
	Aig_ManSetRegNum( pNewAig, loCopied + loCreated );
	Aig_ManCleanup( pNewAig );

	assert( Aig_ManCheck( pNewAig ) );

	Vec_PtrFree(vBarrierLo);
	Vec_PtrFree(vMonotoneBarrierLo);
	Vec_PtrFree(vBarrierLiDriver);
	Vec_PtrFree(vBarrierLi);
	Vec_PtrFree(vMonotoneNodes);

	return pNewAig;
}